

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O1

bool __thiscall google::protobuf::TextFormat::Parser::ParserImpl::SkipField(ParserImpl *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_t sVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  bool bVar6;
  string field_name;
  string local_a8;
  undefined1 *local_88;
  size_t local_80;
  undefined1 local_78 [16];
  string local_68;
  undefined1 *local_48;
  size_t local_40;
  undefined1 local_38 [16];
  
  paVar1 = &local_a8.field_2;
  local_a8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"[","");
  bVar4 = TryConsume(this,&local_a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  if (bVar4) {
    bVar4 = ConsumeTypeUrlOrFullTypeName(this);
    if (!bVar4) {
      return false;
    }
    local_a8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"]","");
    bVar4 = Consume(this,&local_a8);
  }
  else {
    local_a8._M_string_length = 0;
    local_a8.field_2._M_local_buf[0] = '\0';
    local_a8._M_dataplus._M_p = (pointer)paVar1;
    bVar4 = ConsumeIdentifier(this,&local_a8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  if (bVar4 == false) {
    return false;
  }
  local_a8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,":","");
  bVar4 = TryConsume(this,&local_a8);
  if (bVar4) {
    local_88 = local_78;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"{","");
    sVar2 = (this->tokenizer_).current_.text._M_string_length;
    if ((sVar2 == local_80) &&
       ((sVar2 == 0 ||
        (iVar5 = bcmp((this->tokenizer_).current_.text._M_dataplus._M_p,local_88,sVar2), iVar5 == 0)
        ))) goto LAB_002aa1d9;
    local_48 = local_38;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"<","");
    sVar2 = (this->tokenizer_).current_.text._M_string_length;
    bVar3 = true;
    if (sVar2 != local_40) {
      bVar6 = true;
      goto LAB_002aa1df;
    }
    bVar6 = true;
    if (sVar2 != 0) {
      iVar5 = bcmp((this->tokenizer_).current_.text._M_dataplus._M_p,local_48,sVar2);
      bVar6 = iVar5 != 0;
      goto LAB_002aa1df;
    }
  }
  else {
LAB_002aa1d9:
    bVar6 = false;
  }
  bVar3 = bVar6;
  bVar6 = false;
LAB_002aa1df:
  if ((bVar3) && (local_48 != local_38)) {
    operator_delete(local_48);
  }
  if ((bVar4) && (local_88 != local_78)) {
    operator_delete(local_88);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  if (bVar6) {
    bVar4 = SkipFieldValue(this);
  }
  else {
    bVar4 = SkipFieldMessage(this);
  }
  if (bVar4 == false) {
    return false;
  }
  local_a8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,";","");
  bVar4 = TryConsume(this,&local_a8);
  if (!bVar4) {
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,",","");
    TryConsume(this,&local_68);
    if ((!bVar4) &&
       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2)) {
      operator_delete(local_68._M_dataplus._M_p);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  return true;
}

Assistant:

bool SkipField() {
    if (TryConsume("[")) {
      // Extension name or type URL.
      DO(ConsumeTypeUrlOrFullTypeName());
      DO(Consume("]"));
    } else {
      std::string field_name;
      DO(ConsumeIdentifier(&field_name));
    }

    // Try to guess the type of this field.
    // If this field is not a message, there should be a ":" between the
    // field name and the field value and also the field value should not
    // start with "{" or "<" which indicates the beginning of a message body.
    // If there is no ":" or there is a "{" or "<" after ":", this field has
    // to be a message or the input is ill-formed.
    if (TryConsume(":") && !LookingAt("{") && !LookingAt("<")) {
      DO(SkipFieldValue());
    } else {
      DO(SkipFieldMessage());
    }
    // For historical reasons, fields may optionally be separated by commas or
    // semicolons.
    TryConsume(";") || TryConsume(",");
    return true;
  }